

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

bool slang::ast::withAfterDynamic
               (StreamingConcatenationExpression *lhs,SourceRange **dynamic,SourceRange **with)

{
  bool bVar1;
  Expression *this;
  StreamingConcatenationExpression *lhs_00;
  Type *this_00;
  long lVar2;
  StreamExpression *stream;
  pointer this_01;
  
  this_01 = (lhs->streams_).data_;
  for (lVar2 = (lhs->streams_).size_ * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    this = not_null<const_slang::ast::Expression_*>::get(&this_01->operand);
    if (this->kind == Streaming) {
      lhs_00 = Expression::as<slang::ast::StreamingConcatenationExpression>(this);
      bVar1 = withAfterDynamic(lhs_00,dynamic,with);
      if (bVar1) break;
    }
    else if (this_01->withExpr == (Expression *)0x0) {
      if (*dynamic == (SourceRange *)0x0) {
        this_00 = not_null<const_slang::ast::Type_*>::get(&this->type);
        bVar1 = Type::isFixedSize(this_00);
        if (!bVar1) {
          *dynamic = &this->sourceRange;
        }
      }
    }
    else {
      *with = &this_01->withExpr->sourceRange;
      if (*dynamic != (SourceRange *)0x0) break;
    }
    this_01 = this_01 + 1;
  }
  return lVar2 != 0;
}

Assistant:

static bool withAfterDynamic(const StreamingConcatenationExpression& lhs,
                             const SourceRange*& dynamic, const SourceRange*& with) {
    // The expression within the "with" is evaluated immediately before its corresponding array is
    // streamed. The first dynamically sized item without "with" constraints accept all the
    // available data. If the former appears after the latter, evaluation order has conflict.
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            if (withAfterDynamic(operand.as<StreamingConcatenationExpression>(), dynamic, with))
                return true;
        }
        else if (stream.withExpr) {
            with = &stream.withExpr->sourceRange;
            if (dynamic)
                return true;
        }
        else if (!dynamic && !operand.type->isFixedSize()) {
            dynamic = &operand.sourceRange;
        }
    }
    return false;
}